

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBrOnExnExpr
          (BinaryReaderIR *this,Index depth,Index event_index)

{
  Result RVar1;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> this_00;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_a0;
  Location local_98;
  Var local_78;
  
  this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0xd0);
  local_78.loc.field_1.field_0.line = 0;
  local_78.loc.field_1._4_8_ = 0;
  local_78.loc.filename.data_ = (char *)0x0;
  local_78.loc.filename.size_._0_4_ = 0;
  local_78.loc.filename.size_._4_4_ = 0;
  BrOnExnExpr::BrOnExnExpr
            ((BrOnExnExpr *)
             this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&local_78.loc);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,depth,&local_98);
  Var::operator=((Var *)((long)this_00.
                               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                               .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),
                 &local_78);
  Var::~Var(&local_78);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,event_index,&local_98);
  Var::operator=((Var *)((long)this_00.
                               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                               .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x88),
                 &local_78);
  Var::~Var(&local_78);
  local_a0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_a0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrOnExnExpr(Index depth, Index event_index) {
  auto expr = MakeUnique<BrOnExnExpr>();
  expr->label_var = Var(depth);
  expr->event_var = Var(event_index);
  return AppendExpr(std::move(expr));
}